

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleDependenciesTests.cpp
# Opt level: O3

void __thiscall
glcts::MultisampleTextureDependenciesFBOIncompleteness3Test::deinit
          (MultisampleTextureDependenciesFBOIncompleteness3Test *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (this->fbo_id != 0) {
    (**(code **)(lVar2 + 0x78))(0x8ca9,0);
    (**(code **)(lVar2 + 0x440))(1,&this->fbo_id);
    this->fbo_id = 0;
  }
  if (this->to_id_2d_multisample_color_1 != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->to_id_2d_multisample_color_1);
    this->to_id_2d_multisample_color_1 = 0;
  }
  if (this->to_id_2d_multisample_color_2 != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->to_id_2d_multisample_color_2);
    this->to_id_2d_multisample_color_2 = 0;
  }
  if (this->to_id_2d_multisample_depth != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->to_id_2d_multisample_depth);
    this->to_id_2d_multisample_depth = 0;
  }
  if (this->to_id_2d_multisample_depth_stencil != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->to_id_2d_multisample_depth_stencil);
    this->to_id_2d_multisample_depth_stencil = 0;
  }
  tcu::TestNode::deinit((TestNode *)this);
  return;
}

Assistant:

void MultisampleTextureDependenciesFBOIncompleteness3Test::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (fbo_id != 0)
	{
		gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, 0);
		gl.deleteFramebuffers(1, &fbo_id);

		fbo_id = 0;
	}

	if (to_id_2d_multisample_color_1 != 0)
	{
		gl.deleteTextures(1, &to_id_2d_multisample_color_1);

		to_id_2d_multisample_color_1 = 0;
	}

	if (to_id_2d_multisample_color_2 != 0)
	{
		gl.deleteTextures(1, &to_id_2d_multisample_color_2);

		to_id_2d_multisample_color_2 = 0;
	}

	if (to_id_2d_multisample_depth != 0)
	{
		gl.deleteTextures(1, &to_id_2d_multisample_depth);

		to_id_2d_multisample_depth = 0;
	}

	if (to_id_2d_multisample_depth_stencil != 0)
	{
		gl.deleteTextures(1, &to_id_2d_multisample_depth_stencil);

		to_id_2d_multisample_depth_stencil = 0;
	}

	/* Call base class' deinit() */
	TestCase::deinit();
}